

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subscr_storage_vector_based.cpp
# Opt level: O0

void __thiscall
so_5::impl::vector_based_subscr_storage::storage_t::debug_dump(storage_t *this,ostream *to)

{
  bool bVar1;
  int iVar2;
  ostream *poVar3;
  abstract_message_box_t *paVar4;
  undefined4 extraout_var;
  char *pcVar5;
  undefined1 local_58 [40];
  subscr_info_t *e;
  const_iterator __end2;
  const_iterator __begin2;
  subscr_info_vector_t *__range2;
  ostream *to_local;
  storage_t *this_local;
  
  __end2 = std::
           vector<so_5::impl::subscription_storage_common::subscr_info_t,_std::allocator<so_5::impl::subscription_storage_common::subscr_info_t>_>
           ::begin(&this->m_events);
  e = (subscr_info_t *)
      std::
      vector<so_5::impl::subscription_storage_common::subscr_info_t,_std::allocator<so_5::impl::subscription_storage_common::subscr_info_t>_>
      ::end(&this->m_events);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end2,(__normal_iterator<const_so_5::impl::subscription_storage_common::subscr_info_t_*,_std::vector<so_5::impl::subscription_storage_common::subscr_info_t,_std::allocator<so_5::impl::subscription_storage_common::subscr_info_t>_>_>
                                *)&e);
    if (!bVar1) break;
    local_58._32_8_ =
         __gnu_cxx::
         __normal_iterator<const_so_5::impl::subscription_storage_common::subscr_info_t_*,_std::vector<so_5::impl::subscription_storage_common::subscr_info_t,_std::allocator<so_5::impl::subscription_storage_common::subscr_info_t>_>_>
         ::operator*(&__end2);
    poVar3 = std::operator<<(to,"{");
    paVar4 = intrusive_ptr_t<so_5::abstract_message_box_t>::operator->
                       ((intrusive_ptr_t<so_5::abstract_message_box_t> *)local_58._32_8_);
    iVar2 = (*paVar4->_vptr_abstract_message_box_t[2])();
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,CONCAT44(extraout_var,iVar2));
    poVar3 = std::operator<<(poVar3,", ");
    pcVar5 = std::type_index::name((type_index *)(local_58._32_8_ + 8));
    poVar3 = std::operator<<(poVar3,pcVar5);
    poVar3 = std::operator<<(poVar3,", ");
    state_t::query_name_abi_cxx11_((state_t *)local_58);
    poVar3 = std::operator<<(poVar3,(string *)local_58);
    poVar3 = std::operator<<(poVar3,"}");
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string((string *)local_58);
    __gnu_cxx::
    __normal_iterator<const_so_5::impl::subscription_storage_common::subscr_info_t_*,_std::vector<so_5::impl::subscription_storage_common::subscr_info_t,_std::allocator<so_5::impl::subscription_storage_common::subscr_info_t>_>_>
    ::operator++(&__end2);
  }
  return;
}

Assistant:

void
storage_t::debug_dump( std::ostream & to ) const
	{
		for( const auto & e : m_events )
			to << "{" << e.m_mbox->id() << ", "
					<< e.m_msg_type.name() << ", "
					<< e.m_state->query_name() << "}"
					<< std::endl;
	}